

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

void arkInterpFree_Lagrange(ARKodeMem_conflict ark_mem,ARKInterp I)

{
  void *__ptr;
  int *__ptr_00;
  long lVar1;
  long lVar2;
  int iVar4;
  undefined1 auVar3 [16];
  
  if (I != (ARKInterp)0x0) {
    __ptr_00 = (int *)I->content;
    if (__ptr_00 != (int *)0x0) {
      __ptr = *(void **)(__ptr_00 + 2);
      if (__ptr != (void *)0x0) {
        if (0 < __ptr_00[1]) {
          lVar2 = 0;
          lVar1 = 0;
          do {
            if (*(long *)(*(long *)(__ptr_00 + 2) + lVar2) != 0) {
              arkFreeVec(ark_mem,(N_Vector *)(*(long *)(__ptr_00 + 2) + lVar2));
              *(undefined8 *)(*(long *)((long)I->content + 8) + lVar2) = 0;
              __ptr_00 = (int *)I->content;
            }
            lVar1 = lVar1 + 1;
            lVar2 = lVar2 + 8;
          } while (lVar1 < __ptr_00[1]);
          __ptr = *(void **)(__ptr_00 + 2);
        }
        free(__ptr);
        __ptr_00 = (int *)I->content;
        __ptr_00[2] = 0;
        __ptr_00[3] = 0;
      }
      if (*(void **)(__ptr_00 + 4) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 4));
        __ptr_00 = (int *)I->content;
        __ptr_00[4] = 0;
        __ptr_00[5] = 0;
      }
      iVar4 = *__ptr_00 + 1;
      auVar3._4_4_ = *__ptr_00 + 2;
      auVar3._8_4_ = auVar3._4_4_;
      auVar3._12_4_ = -(uint)(auVar3._4_4_ < 0);
      ark_mem->lrw = ark_mem->lrw - CONCAT44(-(uint)(iVar4 < 0),iVar4);
      ark_mem->liw = ark_mem->liw - auVar3._8_8_;
      free(__ptr_00);
      I->content = (void *)0x0;
    }
    if (I->ops != (ARKInterpOps)0x0) {
      free(I->ops);
    }
    free(I);
    return;
  }
  return;
}

Assistant:

void arkInterpFree_Lagrange(ARKodeMem ark_mem, ARKInterp I)
{
  int i;

  /* if interpolation structure is NULL, just return */
  if (I == NULL) { return; }

  /* free content */
  if (I->content != NULL)
  {
    if (LINT_YHIST(I) != NULL)
    {
      for (i = 0; i < LINT_NMAXALLOC(I); i++)
      {
        if (LINT_YJ(I, i) != NULL)
        {
          arkFreeVec(ark_mem, &(LINT_YJ(I, i)));
          LINT_YJ(I, i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
    if (LINT_THIST(I) != NULL)
    {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }

    /* update work space sizes */
    ark_mem->lrw -= (LINT_NMAX(I) + 1);
    ark_mem->liw -= (LINT_NMAX(I) + 2);

    free(I->content);
    I->content = NULL;
  }

  /* free ops and interpolation structures */
  if (I->ops)
  {
    free(I->ops);
    I->ops = NULL;
  }
  free(I);
  I = NULL;

  return;
}